

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O3

void __thiscall
embree::ISPCQuadMesh::ISPCQuadMesh
          (ISPCQuadMesh *this,RTCDevice device,TutorialScene *scene_in,
          Ref<embree::SceneGraph::QuadMeshNode> *in)

{
  uint uVar1;
  RTCGeometry pRVar2;
  Vec3fa **ppVVar3;
  Vec3fa *pVVar4;
  long lVar5;
  size_t size;
  Vec2<float> *pVVar6;
  Quad *pQVar7;
  pointer pvVar8;
  ulong uVar9;
  QuadMeshNode *pQVar10;
  long lVar11;
  Ref<embree::SceneGraph::MaterialNode> local_38;
  
  (this->geom).type = QUAD_MESH;
  (this->geom).geometry = (RTCGeometry)0x0;
  (this->geom).materialID = 0xffffffff;
  (this->geom).visited = false;
  this->positions = (Vec3fa **)0x0;
  this->normals = (Vec3fa **)0x0;
  pRVar2 = (RTCGeometry)rtcNewGeometry(device,1);
  (this->geom).geometry = pRVar2;
  ppVVar3 = (Vec3fa **)
            alignedUSMMalloc((long)(in->ptr->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(in->ptr->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 2,0x10,
                             DEVICE_READ_ONLY);
  this->positions = ppVVar3;
  pQVar10 = in->ptr;
  pvVar8 = (pQVar10->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pQVar10->positions).
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pvVar8) {
    size = 0;
  }
  else {
    lVar11 = 0;
    uVar9 = 0;
    do {
      pVVar4 = copyArrayToUSM<embree::Vec3fa>
                         ((avector<embree::Vec3fa> *)(&pvVar8->field_0x0 + lVar11));
      this->positions[uVar9] = pVVar4;
      uVar9 = uVar9 + 1;
      pQVar10 = in->ptr;
      pvVar8 = (pQVar10->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(pQVar10->positions).
                    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8;
      lVar11 = lVar11 + 0x20;
    } while (uVar9 < (ulong)(lVar5 >> 5));
    size = lVar5 >> 2;
  }
  if ((pQVar10->normals).
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pQVar10->normals).
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppVVar3 = (Vec3fa **)alignedUSMMalloc(size,0x10,DEVICE_READ_ONLY);
    this->normals = ppVVar3;
    pQVar10 = in->ptr;
    if ((pQVar10->positions).
        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pQVar10->positions).
        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar11 = 0;
      uVar9 = 0;
      do {
        pVVar4 = copyArrayToUSM<embree::Vec3fa>
                           ((avector<embree::Vec3fa> *)
                            (&((pQVar10->normals).
                               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar11));
        this->normals[uVar9] = pVVar4;
        pQVar10 = in->ptr;
        uVar9 = uVar9 + 1;
        lVar11 = lVar11 + 0x20;
      } while (uVar9 < (ulong)((long)(pQVar10->positions).
                                     super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pQVar10->positions).
                                     super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
  }
  pVVar6 = copyArrayToUSM<embree::Vec2<float>>(&pQVar10->texcoords);
  this->texcoords = pVVar6;
  pQVar7 = copyArrayToUSM<embree::SceneGraph::QuadMeshNode::Quad>(&in->ptr->quads);
  this->quads = (ISPCQuad *)pQVar7;
  this->startTime = (in->ptr->time_range).lower;
  this->endTime = (in->ptr->time_range).upper;
  this->numTimeSteps =
       (uint)((ulong)((long)(in->ptr->positions).
                            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(in->ptr->positions).
                           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  this->numVertices =
       (uint)((in->ptr->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->size_active;
  uVar1 = (*(in->ptr->super_Node).super_RefCount._vptr_RefCount[0xe])();
  this->numQuads = uVar1;
  local_38.ptr = (in->ptr->material).ptr;
  if (local_38.ptr != (MaterialNode *)0x0) {
    (*((local_38.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  uVar1 = TutorialScene::materialID(scene_in,&local_38);
  (this->geom).materialID = uVar1;
  if (local_38.ptr != (MaterialNode *)0x0) {
    (*((local_38.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  return;
}

Assistant:

ISPCQuadMesh::ISPCQuadMesh (RTCDevice device, TutorialScene* scene_in, Ref<SceneGraph::QuadMeshNode> in) 
    : geom(QUAD_MESH), positions(nullptr), normals(nullptr)
  {
    geom.geometry = rtcNewGeometry (device, RTC_GEOMETRY_TYPE_QUAD);
    
    positions = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*in->numTimeSteps());
    for (size_t i=0; i<in->numTimeSteps(); i++)
      positions[i] = copyArrayToUSM(in->positions[i]);

    if (in->normals.size()) {
      normals = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*in->numTimeSteps());
      for (size_t i=0; i<in->numTimeSteps(); i++)
        normals[i] = copyArrayToUSM(in->normals[i]);
    }
    
    texcoords = copyArrayToUSM(in->texcoords);
    quads = (ISPCQuad*) copyArrayToUSM(in->quads);
    startTime = in->time_range.lower;
    endTime   = in->time_range.upper;
    numTimeSteps = (unsigned) in->numTimeSteps();
    numVertices = (unsigned) in->numVertices();
    numQuads = (unsigned) in->numPrimitives();
    geom.materialID = scene_in->materialID(in->material);
  }